

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextVkImpl::TransitionResourceStates
          (DeviceContextVkImpl *this,Uint32 BarrierCount,StateTransitionDesc *pResourceBarriers)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  bool bVar4;
  RefCntAutoPtr<Diligent::TopLevelASVkImpl> pTopLevelAS;
  RefCntAutoPtr<Diligent::BottomLevelASVkImpl> pBottomLevelAS;
  RefCntAutoPtr<Diligent::BufferVkImpl> pBuffer;
  RefCntAutoPtr<Diligent::TextureVkImpl> pTexture;
  string msg;
  RefCntAutoPtr<Diligent::TopLevelASVkImpl> local_70;
  RefCntAutoPtr<Diligent::BottomLevelASVkImpl> local_68;
  RefCntAutoPtr<Diligent::BufferVkImpl> local_60;
  RefCntAutoPtr<Diligent::TextureVkImpl> local_58;
  string local_50;
  
  uVar3 = (ulong)BarrierCount;
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject !=
      (RenderPassVkImpl *)0x0) {
    FormatString<char[55]>
              (&local_50,(char (*) [55])"State transitions are not allowed inside a render pass");
    DebugAssertionFailed
              ((Char *)CONCAT44(local_50._M_dataplus._M_p._4_4_,local_50._M_dataplus._M_p._0_4_),
               "TransitionResourceStates",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xd22);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (BarrierCount != 0) {
    EnsureVkCmdBuffer(this);
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifyStateTransitionDesc
                ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pResourceBarriers);
      if (pResourceBarriers->TransitionType == STATE_TRANSITION_TYPE_BEGIN) {
        if ((pResourceBarriers->Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) !=
            STATE_TRANSITION_FLAG_NONE) {
          FormatString<char[55]>
                    (&local_50,
                     (char (*) [55])"Resource state can\'t be updated in begin-split barrier");
          DebugAssertionFailed
                    ((Char *)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                      local_50._M_dataplus._M_p._0_4_),"TransitionResourceStates",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0xd32);
          std::__cxx11::string::~string((string *)&local_50);
        }
      }
      else if ((pResourceBarriers->Flags & STATE_TRANSITION_FLAG_ALIASING) ==
               STATE_TRANSITION_FLAG_NONE) {
        if ((pResourceBarriers->TransitionType & ~STATE_TRANSITION_TYPE_END) !=
            STATE_TRANSITION_TYPE_IMMEDIATE) {
          FormatString<char[24]>(&local_50,(char (*) [24])"Unexpected barrier type");
          DebugAssertionFailed
                    ((Char *)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                      local_50._M_dataplus._M_p._0_4_),"TransitionResourceStates",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0xd3b);
          std::__cxx11::string::~string((string *)&local_50);
        }
        RefCntAutoPtr<Diligent::TextureVkImpl>::RefCntAutoPtr
                  (&local_58,&pResourceBarriers->pResource->super_IObject,
                   (INTERFACE_ID *)IID_TextureVk);
        if (local_58.m_pObject == (TextureVkImpl *)0x0) {
          RefCntAutoPtr<Diligent::BufferVkImpl>::RefCntAutoPtr
                    (&local_60,&pResourceBarriers->pResource->super_IObject,
                     (INTERFACE_ID *)IID_BufferVk);
          if (local_60.m_pObject == (BufferVkImpl *)0x0) {
            RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::RefCntAutoPtr
                      (&local_68,&pResourceBarriers->pResource->super_IObject,
                       (INTERFACE_ID *)IID_BottomLevelAS);
            if (local_68.m_pObject == (BottomLevelASVkImpl *)0x0) {
              RefCntAutoPtr<Diligent::TopLevelASVkImpl>::RefCntAutoPtr
                        (&local_70,&pResourceBarriers->pResource->super_IObject,
                         (INTERFACE_ID *)IID_TopLevelAS);
              if (local_70.m_pObject == (TopLevelASVkImpl *)0x0) {
                FormatString<char[26]>(&local_50,(char (*) [26])"unsupported resource type");
                DebugAssertionFailed
                          ((Char *)CONCAT44(local_50._M_dataplus._M_p._4_4_,
                                            local_50._M_dataplus._M_p._0_4_),
                           "TransitionResourceStates",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                           ,0xd55);
                std::__cxx11::string::~string((string *)&local_50);
              }
              else {
                TransitionTLASState(this,local_70.m_pObject,pResourceBarriers->OldState,
                                    pResourceBarriers->NewState,
                                    (bool)(pResourceBarriers->Flags &
                                          STATE_TRANSITION_FLAG_UPDATE_STATE));
              }
              RefCntAutoPtr<Diligent::TopLevelASVkImpl>::Release(&local_70);
            }
            else {
              TransitionBLASState(this,local_68.m_pObject,pResourceBarriers->OldState,
                                  pResourceBarriers->NewState,
                                  (bool)(pResourceBarriers->Flags &
                                        STATE_TRANSITION_FLAG_UPDATE_STATE));
            }
            RefCntAutoPtr<Diligent::BottomLevelASVkImpl>::Release(&local_68);
          }
          else {
            TransitionBufferState
                      (this,local_60.m_pObject,pResourceBarriers->OldState,
                       pResourceBarriers->NewState,
                       (bool)(pResourceBarriers->Flags & STATE_TRANSITION_FLAG_UPDATE_STATE));
          }
          RefCntAutoPtr<Diligent::BufferVkImpl>::Release(&local_60);
        }
        else {
          local_50._M_dataplus._M_p._0_4_ = 0;
          uVar1 = pResourceBarriers->FirstMipLevel;
          uVar2 = pResourceBarriers->MipLevelsCount;
          local_50._12_8_ = *(undefined8 *)&pResourceBarriers->FirstArraySlice;
          local_50._M_dataplus._M_p._4_4_ = uVar1;
          local_50._M_string_length._0_4_ = uVar2;
          TransitionTextureState
                    (this,local_58.m_pObject,pResourceBarriers->OldState,pResourceBarriers->NewState
                     ,pResourceBarriers->Flags,(VkImageSubresourceRange *)&local_50);
        }
        RefCntAutoPtr<Diligent::TextureVkImpl>::Release(&local_58);
      }
      else {
        AliasingBarrier(this,pResourceBarriers->pResourceBefore,pResourceBarriers->pResource);
      }
      pResourceBarriers = pResourceBarriers + 1;
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::TransitionResourceStates(Uint32 BarrierCount, const StateTransitionDesc* pResourceBarriers)
{
    VERIFY(m_pActiveRenderPass == nullptr, "State transitions are not allowed inside a render pass");

    if (BarrierCount == 0)
        return;

    EnsureVkCmdBuffer();

    for (Uint32 i = 0; i < BarrierCount; ++i)
    {
        const StateTransitionDesc& Barrier = pResourceBarriers[i];
#ifdef DILIGENT_DEVELOPMENT
        DvpVerifyStateTransitionDesc(Barrier);
#endif
        if (Barrier.TransitionType == STATE_TRANSITION_TYPE_BEGIN)
        {
            // Skip begin-split barriers
            VERIFY((Barrier.Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) == 0, "Resource state can't be updated in begin-split barrier");
            continue;
        }
        if (Barrier.Flags & STATE_TRANSITION_FLAG_ALIASING)
        {
            AliasingBarrier(Barrier.pResourceBefore, Barrier.pResource);
        }
        else
        {
            VERIFY(Barrier.TransitionType == STATE_TRANSITION_TYPE_IMMEDIATE || Barrier.TransitionType == STATE_TRANSITION_TYPE_END, "Unexpected barrier type");

            if (RefCntAutoPtr<TextureVkImpl> pTexture{Barrier.pResource, IID_TextureVk})
            {
                VkImageSubresourceRange SubResRange;
                SubResRange.aspectMask     = 0;
                SubResRange.baseMipLevel   = Barrier.FirstMipLevel;
                SubResRange.levelCount     = (Barrier.MipLevelsCount == REMAINING_MIP_LEVELS) ? VK_REMAINING_MIP_LEVELS : Barrier.MipLevelsCount;
                SubResRange.baseArrayLayer = Barrier.FirstArraySlice;
                SubResRange.layerCount     = (Barrier.ArraySliceCount == REMAINING_ARRAY_SLICES) ? VK_REMAINING_ARRAY_LAYERS : Barrier.ArraySliceCount;
                TransitionTextureState(*pTexture, Barrier.OldState, Barrier.NewState, Barrier.Flags, &SubResRange);
            }
            else if (RefCntAutoPtr<BufferVkImpl> pBuffer{Barrier.pResource, IID_BufferVk})
            {
                TransitionBufferState(*pBuffer, Barrier.OldState, Barrier.NewState, (Barrier.Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) != 0);
            }
            else if (RefCntAutoPtr<BottomLevelASVkImpl> pBottomLevelAS{Barrier.pResource, IID_BottomLevelAS})
            {
                TransitionBLASState(*pBottomLevelAS, Barrier.OldState, Barrier.NewState, (Barrier.Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) != 0);
            }
            else if (RefCntAutoPtr<TopLevelASVkImpl> pTopLevelAS{Barrier.pResource, IID_TopLevelAS})
            {
                TransitionTLASState(*pTopLevelAS, Barrier.OldState, Barrier.NewState, (Barrier.Flags & STATE_TRANSITION_FLAG_UPDATE_STATE) != 0);
            }
            else
            {
                UNEXPECTED("unsupported resource type");
            }
        }
    }
}